

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.cpp
# Opt level: O2

ssize_t readline::read(int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined4 in_register_0000003c;
  
  linenoise::LoadHistory(*(char **)__nbytes);
  bVar1 = linenoise::Readline(*__buf,(string *)CONCAT44(in_register_0000003c,__fd));
  if (!bVar1) {
    linenoise::AddHistory((((string *)CONCAT44(in_register_0000003c,__fd))->_M_dataplus)._M_p);
    linenoise::SaveHistory(*(char **)__nbytes);
  }
  return CONCAT71(extraout_var,bVar1) & 0xffffffff ^ 1;
}

Assistant:

bool read(std::string& input, const std::string& prompt,
          const std::string& history_path)
{
    linenoise::LoadHistory(history_path.c_str());

    const auto eof = linenoise::Readline(prompt.c_str(), input);

    if (eof)
        return false;

    linenoise::AddHistory(input.c_str());
    linenoise::SaveHistory(history_path.c_str());

    return true;
}